

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O0

bool vkt::pipeline::isVertexFormatSfloat(VkFormat format)

{
  bool local_9;
  VkFormat format_local;
  
  if (((((format == VK_FORMAT_R16_SFLOAT) || (format == VK_FORMAT_R16G16_SFLOAT)) ||
       (format == VK_FORMAT_R16G16B16_SFLOAT)) ||
      ((((format == VK_FORMAT_R16G16B16A16_SFLOAT || (format == VK_FORMAT_R32_SFLOAT)) ||
        ((format == VK_FORMAT_R32G32_SFLOAT ||
         ((format == VK_FORMAT_R32G32B32_SFLOAT || (format == VK_FORMAT_R32G32B32A32_SFLOAT)))))) ||
       (format == VK_FORMAT_R64_SFLOAT)))) ||
     (((format == VK_FORMAT_R64G64_SFLOAT || (format == VK_FORMAT_R64G64B64_SFLOAT)) ||
      (format == VK_FORMAT_R64G64B64A64_SFLOAT)))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool isVertexFormatSfloat (VkFormat format)
{
	switch (format)
	{
		case VK_FORMAT_R16_SFLOAT:
		case VK_FORMAT_R16G16_SFLOAT:
		case VK_FORMAT_R32_SFLOAT:
		case VK_FORMAT_R16G16B16_SFLOAT:
		case VK_FORMAT_R16G16B16A16_SFLOAT:
		case VK_FORMAT_R32G32_SFLOAT:
		case VK_FORMAT_R64_SFLOAT:
		case VK_FORMAT_R32G32B32_SFLOAT:
		case VK_FORMAT_R32G32B32A32_SFLOAT:
		case VK_FORMAT_R64G64_SFLOAT:
		case VK_FORMAT_R64G64B64_SFLOAT:
		case VK_FORMAT_R64G64B64A64_SFLOAT:
			return true;

		default:
			break;
	}

	return false;

}